

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_singletons.c
# Opt level: O3

lu_int __thiscall lu_singletons(void *this,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx)

{
  int *piVar1;
  lu_int *pinv;
  size_t __n;
  double abstol;
  int m;
  int iVar2;
  int iVar3;
  double *Lx;
  double *Lx_00;
  double *Ux;
  lu_int *Lp;
  lu_int *Ui;
  double *Ux_00;
  lu_int *Up;
  lu_int *Ui_00;
  double *col_pivot;
  double *Bx_00;
  lu_int *Bti;
  lu_int *Bti_00;
  bool bVar4;
  int iVar5;
  lu_int lVar6;
  lu_int lVar7;
  ulong uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  lu_int *plVar17;
  double *Btx;
  
  m = *(int *)((long)this + 0x54);
  uVar16 = (ulong)m;
  iVar9 = *this;
  iVar10 = *(int *)((long)this + 8);
  abstol = *(double *)((long)this + 0x18);
  iVar2 = *(int *)((long)this + 0x28);
  Lx = *(double **)((long)this + 600);
  Lx_00 = *(double **)((long)this + 0x268);
  Ux = *(double **)((long)this + 0x278);
  Btx = *(double **)((long)this + 0x280);
  Lp = *(lu_int **)((long)this + 0x2a8);
  Ui = *(lu_int **)((long)this + 0x1a0);
  Ux_00 = *(double **)((long)this + 0x1b8);
  Up = *(lu_int **)((long)this + 0x1a8);
  Ui_00 = *(lu_int **)((long)this + 0x1c0);
  col_pivot = *(double **)((long)this + 0x210);
  Bx_00 = *(double **)((long)this + 0x218);
  Bti = *(lu_int **)((long)this + 0x1b0);
  Bti_00 = *(lu_int **)((long)this + 0x1c8);
  if ((long)uVar16 < 1) {
    iVar14 = 0;
  }
  else {
    lVar15 = 1;
    iVar14 = 0;
    do {
      iVar5 = Bend[lVar15 + -1];
      iVar3 = Bbegin[lVar15 + -1];
      iVar13 = iVar5 - iVar3;
      if (iVar5 < iVar3) {
        iVar13 = 0;
      }
      iVar14 = iVar13 + iVar14;
    } while ((lVar15 < (long)uVar16) && (lVar15 = lVar15 + 1, iVar3 <= iVar5));
    if (iVar5 < iVar3) {
      return -4;
    }
  }
  if (iVar14 - iVar9 != 0 && iVar9 <= iVar14) {
    *(int *)((long)this + 0x58) = iVar14 - iVar9;
  }
  iVar5 = iVar14 - *(int *)((long)this + 4);
  if (iVar5 != 0 && *(int *)((long)this + 4) <= iVar14) {
    *(int *)((long)this + 0x5c) = iVar5;
    if (iVar14 <= iVar10) {
      return 1;
    }
LAB_003b968e:
    *(int *)((long)this + 0x60) = iVar14 - iVar10;
    return 1;
  }
  if (iVar10 < iVar14) goto LAB_003b968e;
  if (iVar9 < iVar14) {
    return 1;
  }
  __n = uVar16 * 4;
  plVar17 = (lu_int *)0x3b96db;
  memset(col_pivot,0,__n);
  if (0 < m) {
    lVar15 = 0;
    do {
      lVar11 = (long)Bbegin[lVar15];
      if (Bbegin[lVar15] < Bend[lVar15]) {
        do {
          lVar12 = lVar11 + 1;
          iVar9 = Bi[lVar11];
          if ((long)iVar9 < 0) {
            return -4;
          }
          if (m <= iVar9) {
            return -4;
          }
          piVar1 = (int *)((long)col_pivot + (long)iVar9 * 4);
          *piVar1 = *piVar1 + 1;
        } while ((iVar9 < m) && (lVar11 = lVar12, lVar12 < Bend[lVar15]));
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (long)uVar16);
    if (0 < m) {
      uVar8 = 0;
      iVar9 = 0;
      do {
        *(int *)((long)Bx_00 + uVar8 * 4) = iVar9;
        iVar10 = *(int *)((long)col_pivot + uVar8 * 4) + iVar9;
        *(int *)((long)col_pivot + uVar8 * 4) = iVar9;
        uVar8 = uVar8 + 1;
        iVar9 = iVar10;
      } while (uVar16 != uVar8);
      *(int *)((long)Bx_00 + uVar16 * 4) = iVar10;
      if (0 < m) {
        bVar4 = true;
        uVar8 = 0;
        do {
          lVar15 = (long)Bbegin[uVar8];
          if (Bbegin[uVar8] < Bend[uVar8]) {
            do {
              lVar12 = (long)Bi[lVar15];
              iVar9 = *(int *)((long)col_pivot + lVar12 * 4);
              lVar11 = (long)iVar9;
              *(int *)((long)col_pivot + lVar12 * 4) = iVar9 + 1;
              Bti[lVar11] = (lu_int)uVar8;
              *(double *)(Bti_00 + lVar11 * 2) = Bx[lVar15];
              if ((*(int *)((long)Bx_00 + lVar12 * 4) < iVar9) && (uVar8 == (uint)Bti[lVar11 + -1]))
              {
                bVar4 = false;
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < Bend[uVar8]);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar16);
        if (!bVar4) {
          return -4;
        }
        if (0 < m) {
          memset(Lx,0xff,__n);
          plVar17 = (lu_int *)0x3b981d;
          memset(Lx_00,0xff,__n);
        }
      }
      goto LAB_003b9840;
    }
  }
  *(undefined4 *)((long)Bx_00 + uVar16 * 4) = 0;
LAB_003b9840:
  pinv = (lu_int *)((long)col_pivot + uVar16 * 4);
  *(undefined4 *)Btx = 0;
  *(undefined4 *)Ux = 0;
  lVar7 = (lu_int)pinv;
  if (iVar2 < 0) {
    lVar6 = singleton_rows(m,Bbegin,Bend,Bi,Bx,(lu_int *)Bx_00,Bti,Btx,(lu_int *)Ux,Ui,Ux_00,Lp,
                           (lu_int *)Lx,Lx_00,col_pivot,pinv,(lu_int *)0x0,plVar17,(lu_int *)Btx,
                           lVar7,abstol);
    lVar7 = singleton_cols(m,Bbegin,Bend,Bi,Bx_00,Bti,Bti_00,Btx,Up,Ui_00,Ux,Ui,Lp,Lx,Lx_00,
                           (lu_int *)col_pivot,pinv,(lu_int *)CONCAT44(extraout_var_00,lVar6),
                           (lu_int *)Btx,lVar7,abstol);
  }
  else {
    plVar17 = (lu_int *)0x0;
    lVar6 = singleton_cols(m,Bbegin,Bend,Bi,Bx_00,Bti,Bti_00,Btx,Up,Ui_00,Ux,Ui,Lp,Lx,Lx_00,
                           (lu_int *)col_pivot,pinv,(lu_int *)0x0,(lu_int *)Btx,lVar7,abstol);
    lVar7 = singleton_rows(m,Bbegin,Bend,Bi,Bx,(lu_int *)Bx_00,Bti,Btx,(lu_int *)Ux,Ui,Ux_00,Lp,
                           (lu_int *)Lx,Lx_00,col_pivot,pinv,(lu_int *)CONCAT44(extraout_var,lVar6),
                           plVar17,(lu_int *)Btx,lVar7,abstol);
  }
  if (0 < m) {
    uVar8 = 0;
    do {
      if (*(int *)((long)Lx + uVar8 * 4) < 0) {
        *(undefined4 *)((long)Lx + uVar8 * 4) = 0xffffffff;
      }
      uVar8 = uVar8 + 1;
    } while (uVar16 != uVar8);
    if (0 < m) {
      uVar8 = 0;
      do {
        if (*(int *)((long)Lx_00 + uVar8 * 4) < 0) {
          *(undefined4 *)((long)Lx_00 + uVar8 * 4) = 0xffffffff;
        }
        uVar8 = uVar8 + 1;
      } while (uVar16 != uVar8);
    }
  }
  *(int *)((long)this + 0x138) = iVar14;
  *(lu_int *)((long)this + 0x13c) = lVar7;
  return 0;
}

Assistant:

lu_int lu_singletons(
    struct lu *this, const lu_int *Bbegin, const lu_int *Bend, const lu_int *Bi,
    const double *Bx)
{
    const lu_int m      = this->m;
    const lu_int Lmem   = this->Lmem;
    const lu_int Umem   = this->Umem;
    const lu_int Wmem   = this->Wmem;
    const double abstol = this->abstol;
    const lu_int nzbias = this->nzbias;
    lu_int *pinv        = this->pinv;
    lu_int *qinv        = this->qinv;
    lu_int *Lbegin_p    = this->Lbegin_p;
    lu_int *Ubegin      = this->Ubegin;
    double *col_pivot   = this->col_pivot;
    lu_int *Lindex      = this->Lindex;
    double *Lvalue      = this->Lvalue;
    lu_int *Uindex      = this->Uindex;
    double *Uvalue      = this->Uvalue;
    lu_int *iwork1      = this->iwork1;
    lu_int *iwork2      = iwork1 + m;

    lu_int *Btp         = this->Wbegin; /* build B rowwise in W */
    lu_int *Bti         = this->Windex;
    double *Btx         = this->Wvalue;

    lu_int i, j, pos, put, rank, Bnz, ok;

    /* -------------------------------- */
    /* Check matrix and build transpose */
    /* -------------------------------- */

    /* Check pointers and count nnz(B). */
    Bnz = 0;
    ok = 1;
    for (j = 0; j < m && ok; j++)
    {
        if (Bend[j] < Bbegin[j])
            ok = 0;
        else
            Bnz += Bend[j] - Bbegin[j];
    }
    if (!ok)
        return BASICLU_ERROR_invalid_argument;

    /* Check if sufficient memory in L, U, W. */
    ok = 1;
    if (Lmem < Bnz) { this->addmemL = Bnz-Lmem; ok = 0; }
    if (Umem < Bnz) { this->addmemU = Bnz-Umem; ok = 0; }
    if (Wmem < Bnz) { this->addmemW = Bnz-Wmem; ok = 0; }
    if (!ok)
        return BASICLU_REALLOCATE;

    /* Count nz per row, check indices. */
    memset(iwork1, 0, m*sizeof(lu_int)); /* row counts */
    ok = 1;
    for (j = 0; j < m && ok; j++)
    {
        for (pos = Bbegin[j]; pos < Bend[j] && ok; pos++)
        {
            i = Bi[pos];
            if (i < 0 || i >= m)
                ok = 0;
            else
                iwork1[i]++;
        }
    }
    if (!ok)
        return BASICLU_ERROR_invalid_argument;

    /* Pack matrix rowwise, check for duplicates. */
    put = 0;
    for (i = 0; i < m; i++)     /* set row pointers */
    {
        Btp[i] = put;
        put += iwork1[i];
        iwork1[i] = Btp[i];
    }
    Btp[m] = put;
    assert(put == Bnz);
    ok = 1;
    for (j = 0; j < m; j++)     /* fill rows */
    {
        for (pos = Bbegin[j]; pos < Bend[j]; pos++)
        {
            i = Bi[pos];
            put = iwork1[i]++;
            Bti[put] = j;
            Btx[put] = Bx [pos];
            if (put > Btp[i] && Bti[put-1] == j)
                ok = 0;
        }
    }
    if (!ok)
        return BASICLU_ERROR_invalid_argument;

    /* ---------------- */
    /* Pivot singletons */
    /* ---------------- */

    /* No pivot rows or pivot columns so far. */
    for (i = 0; i < m; i++)
        pinv[i] = -1;
    for (j = 0; j < m; j++)
        qinv[j] = -1;

    if (nzbias >= 0)            /* put more in U */
    {
        Lbegin_p[0] = Ubegin[0] = rank = 0;

        rank = singleton_cols(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);

        rank = singleton_rows(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);
    }
    else                        /* put more in L */
    {
        Lbegin_p[0] = Ubegin[0] = rank = 0;

        rank = singleton_rows(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);

        rank = singleton_cols(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);
    }

    /* pinv, qinv were used as nonzero counters. Reset to -1 if not pivoted. */
    for (i = 0; i < m; i++)
        if (pinv[i] < 0)
            pinv[i] = -1;
    for (j = 0; j < m; j++)
        if (qinv[j] < 0)
            qinv[j] = -1;

    this->matrix_nz = Bnz;
    this->rank = rank;
    return BASICLU_OK;
}